

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::test_run_start(XmlReporter *this)

{
  char *pcVar1;
  XmlWriter *this_00;
  ScopedElement *pSVar2;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  char *local_120;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8 [32];
  undefined1 local_c8 [16];
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string binary_name;
  XmlReporter *this_local;
  
  binary_name.field_2._8_8_ = this;
  pcVar1 = String::c_str(&this->opt->binary_name);
  pcVar1 = skipPathFromFilename(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"doctest",&local_69);
  this_00 = XmlWriter::startElement(&this->xml,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"binary",&local_91);
  XmlWriter::writeAttribute(this_00,&local_90,(string *)local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if ((this->opt->no_version & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"version",(allocator<char> *)(local_c8 + 0xf));
    XmlWriter::writeAttribute(&this->xml,&local_b8,"2.4.6");
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0xf));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"Options",&local_e9);
  XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)&this->xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"order_by",&local_111);
  local_120 = String::c_str(&this->opt->order_by);
  pSVar2 = (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                     ((ScopedElement *)local_c8,&local_110,&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"rand_seed",&local_141);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                     (pSVar2,&local_140,&this->opt->rand_seed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"first",&local_169);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                     (pSVar2,&local_168,&this->opt->first);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"last",&local_191);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                     (pSVar2,&local_190,&this->opt->last);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"abort_after",&local_1b9);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<int>(pSVar2,&local_1b8,&this->opt->abort_after);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"subcase_filter_levels",&local_1e1);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<int>
                     (pSVar2,&local_1e0,&this->opt->subcase_filter_levels);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"case_sensitive",&local_209);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<bool>
                     (pSVar2,&local_208,&this->opt->case_sensitive);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"no_throw",&local_231);
  pSVar2 = XmlWriter::ScopedElement::writeAttribute<bool>(pSVar2,&local_230,&this->opt->no_throw);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"no_skip",&local_259);
  XmlWriter::ScopedElement::writeAttribute<bool>(pSVar2,&local_258,&this->opt->no_skip);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void test_run_start() override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS

            xml.startElement("doctest").writeAttribute("binary", binary_name);
            if(opt.no_version == false)
                xml.writeAttribute("version", DOCTEST_VERSION_STR);

            // only the consequential ones (TODO: filters)
            xml.scopedElement("Options")
                    .writeAttribute("order_by", opt.order_by.c_str())
                    .writeAttribute("rand_seed", opt.rand_seed)
                    .writeAttribute("first", opt.first)
                    .writeAttribute("last", opt.last)
                    .writeAttribute("abort_after", opt.abort_after)
                    .writeAttribute("subcase_filter_levels", opt.subcase_filter_levels)
                    .writeAttribute("case_sensitive", opt.case_sensitive)
                    .writeAttribute("no_throw", opt.no_throw)
                    .writeAttribute("no_skip", opt.no_skip);
        }